

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_point_query_base.h
# Opt level: O2

void __thiscall
S2ClosestPointQueryBase<S2MinDistance,_int>::MaybeAddResult
          (S2ClosestPointQueryBase<S2MinDistance,_int> *this,PointData *point_data)

{
  _Head_base<0UL,_Vector3<double>,_false> *p_Var1;
  priority_queue<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_absl::InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>,_std::less<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  *this_00;
  S2Region *pSVar2;
  int iVar3;
  const_reference pRVar4;
  Options *pOVar5;
  S1ChordAngle SVar6;
  Result result;
  S2MinDistance distance;
  value_type local_30;
  S1ChordAngle local_20;
  
  local_20.length2_ = (this->distance_limit_).super_S1ChordAngle.length2_;
  p_Var1 = &(point_data->tuple_).super__Tuple_impl<0UL,_Vector3<double>,_int>.
            super__Head_base<0UL,_Vector3<double>,_false>;
  iVar3 = (*this->target_->_vptr_S2DistanceTarget[3])(this->target_,p_Var1);
  if ((char)iVar3 != '\0') {
    pOVar5 = this->options_;
    pSVar2 = pOVar5->region_;
    if (pSVar2 != (S2Region *)0x0) {
      iVar3 = (*pSVar2->_vptr_S2Region[8])(pSVar2,p_Var1);
      if ((char)iVar3 == '\0') {
        return;
      }
      pOVar5 = this->options_;
    }
    local_30.distance_.super_S1ChordAngle.length2_ = (S1ChordAngle)(S1ChordAngle)local_20.length2_;
    iVar3 = pOVar5->max_results_;
    local_30.point_data_ = point_data;
    if ((long)iVar3 == 0x7fffffff) {
      std::
      vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
      ::push_back(&this->result_vector_,&local_30);
    }
    else {
      if (iVar3 == 1) {
        (this->result_singleton_).distance_.super_S1ChordAngle.length2_ = local_20.length2_;
        (this->result_singleton_).point_data_ = point_data;
        SVar6.length2_ = local_20.length2_;
      }
      else {
        this_00 = &this->result_set_;
        if ((ulong)(long)iVar3 <= (this->result_set_).c.allocator_and_tag_.tag_.size_ >> 1) {
          std::
          priority_queue<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_absl::InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>,_std::less<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
          ::pop(this_00);
        }
        std::
        priority_queue<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_absl::InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>,_std::less<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
        ::push(this_00,&local_30);
        if ((this->result_set_).c.allocator_and_tag_.tag_.size_ >> 1 <
            (ulong)(long)this->options_->max_results_) {
          return;
        }
        pRVar4 = absl::
                 InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
                 ::front(&this_00->c);
        SVar6.length2_ = (pRVar4->distance_).super_S1ChordAngle.length2_;
        pOVar5 = this->options_;
      }
      SVar6 = operator-(SVar6,(pOVar5->max_error_).length2_);
      (this->distance_limit_).super_S1ChordAngle.length2_ = SVar6.length2_;
    }
  }
  return;
}

Assistant:

void S2ClosestPointQueryBase<Distance, Data>::MaybeAddResult(
    const PointData* point_data) {
  Distance distance = distance_limit_;
  if (!target_->UpdateMinDistance(point_data->point(), &distance)) return;

  const S2Region* region = options().region();
  if (region && !region->Contains(point_data->point())) return;

  Result result(distance, point_data);
  if (options().max_results() == 1) {
    // Optimization for the common case where only the closest point is wanted.
    result_singleton_ = result;
    distance_limit_ = result.distance() - options().max_error();
  } else if (options().max_results() == Options::kMaxMaxResults) {
    result_vector_.push_back(result);  // Sort/unique at end.
  } else {
    // Add this point to result_set_.  Note that with the current algorithm
    // each candidate point is considered at most once (except for one special
    // case where max_results() == 1, see InitQueue for details), so we don't
    // need to worry about possibly adding a duplicate entry here.
    if (result_set_.size() >= options().max_results()) {
      result_set_.pop();  // Replace the furthest result point.
    }
    result_set_.push(result);
    if (result_set_.size() >= options().max_results()) {
      distance_limit_ = result_set_.top().distance() - options().max_error();
    }
  }
}